

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcalendarwidget.cpp
# Opt level: O1

void __thiscall
QtPrivate::QCalendarDateValidator::handleKeyEvent
          (QCalendarDateValidator *this,long keyEvent,undefined8 param_3)

{
  int iVar1;
  pointer pSVar2;
  Section SVar3;
  ulong uVar4;
  
  if ((long)this->m_currentToken < 0) {
    return;
  }
  iVar1 = *(int *)(keyEvent + 0x40);
  if (this->m_lastSectionMove == NextSection) {
    if (iVar1 < 0x1000014) {
      if (iVar1 == 0x1000003) {
LAB_003ce20f:
        this->m_currentToken =
             (int)(((long)this->m_currentToken - 1U) %
                  (ulong)((long)(this->m_tokens).
                                super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_tokens).
                                super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4));
        goto LAB_003ce1c4;
      }
      if (iVar1 != 0x1000012) goto LAB_003ce255;
      goto LAB_003ce1ee;
    }
    if (iVar1 != 0x1000014) {
      if (iVar1 != 0x1000061) goto LAB_003ce255;
      goto LAB_003ce20f;
    }
LAB_003ce22b:
    if (this->m_currentToken < 0) goto LAB_003ce255;
    uVar4 = (ulong)(uint)this->m_currentToken + 1;
  }
  else {
LAB_003ce1c4:
    if (iVar1 != 0x1000012) {
      if (iVar1 != 0x1000014) goto LAB_003ce255;
      goto LAB_003ce22b;
    }
LAB_003ce1ee:
    if ((long)this->m_currentToken < 0) goto LAB_003ce255;
    uVar4 = (long)this->m_currentToken - 1;
  }
  this->m_currentToken = (int)uVar4;
  this->m_currentToken =
       (int)(uVar4 % (ulong)((long)(this->m_tokens).
                                   super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_tokens).
                                   super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
LAB_003ce255:
  pSVar2 = (this->m_tokens).
           super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->m_tokens).
                    super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar2 >> 4) <=
      (ulong)(long)this->m_currentToken) {
    handleKeyEvent();
  }
  SVar3 = (*(pSVar2[this->m_currentToken].validator)->_vptr_QCalendarDateSectionValidator[2])();
  this->m_lastSectionMove = SVar3;
  applyToDate(this,param_3);
  if (this->m_lastSectionMove == PrevSection) {
    if ((long)this->m_currentToken < 0) {
      return;
    }
    uVar4 = (long)this->m_currentToken - 1;
  }
  else {
    if (this->m_lastSectionMove != NextSection) {
      return;
    }
    if (this->m_currentToken < 0) {
      return;
    }
    uVar4 = (ulong)(uint)this->m_currentToken + 1;
  }
  this->m_currentToken = (int)uVar4;
  this->m_currentToken =
       (int)(uVar4 % (ulong)((long)(this->m_tokens).
                                   super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_tokens).
                                   super__Vector_base<QtPrivate::SectionToken,_std::allocator<QtPrivate::SectionToken>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 4));
  return;
}

Assistant:

void QCalendarDateValidator::handleKeyEvent(QKeyEvent *keyEvent,QCalendar cal)
{
    if (m_currentToken < 0)
        return;

    int key = keyEvent->key();
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection) {
        if (key == Qt::Key_Back || key == Qt::Key_Backspace)
            toPreviousToken();
    }
    if (key == Qt::Key_Right)
        toNextToken();
    else if (key == Qt::Key_Left)
        toPreviousToken();

    m_lastSectionMove = m_tokens[m_currentToken].validator->handleKey(key);

    applyToDate(cal);
    if (m_lastSectionMove == QCalendarDateSectionValidator::NextSection)
        toNextToken();
    else if (m_lastSectionMove == QCalendarDateSectionValidator::PrevSection)
        toPreviousToken();
}